

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O0

bool __thiscall
QOpenGLTextureBlitterPrivate::buildProgram
          (QOpenGLTextureBlitterPrivate *this,ProgramIndex idx,char *vs,char *fs)

{
  bool bVar1;
  int iVar2;
  QMessageLogger *this_00;
  QOpenGLShaderProgram *pQVar3;
  QOpenGLShaderProgram *pQVar4;
  QString *t;
  socklen_t __len;
  long lVar5;
  sockaddr *__addr;
  QFlagsStorage<QOpenGLShader::ShaderTypeBit> in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  double __x;
  Program *p;
  GLint in_stack_ffffffffffffff48;
  ShaderTypeBit in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  QObject *in_stack_ffffffffffffff58;
  QMessageLogger *this_01;
  undefined4 in_stack_ffffffffffffff98;
  QOpenGLShaderProgram local_50 [3];
  QDebug local_18;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (ulong)in_ESI.i * 0x30;
  this_00 = (QMessageLogger *)(in_RDI + 0x18 + lVar5);
  this_01 = this_00;
  pQVar3 = (QOpenGLShaderProgram *)operator_new(0x10);
  __len = (socklen_t)lVar5;
  QOpenGLShaderProgram::QOpenGLShaderProgram
            ((QOpenGLShaderProgram *)this_01,in_stack_ffffffffffffff58);
  QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::reset
            ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QOpenGLShaderProgram *)in_stack_ffffffffffffff58);
  QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
            ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *)
             this_00);
  QFlags<QOpenGLShader::ShaderTypeBit>::QFlags
            ((QFlags<QOpenGLShader::ShaderTypeBit> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
            );
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode
            (pQVar3,(ShaderType)in_ESI.i,(char *)this_01);
  QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
            ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *)
             this_00);
  QFlags<QOpenGLShader::ShaderTypeBit>::QFlags
            ((QFlags<QOpenGLShader::ShaderTypeBit> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
            );
  iVar2 = local_10;
  QOpenGLShaderProgram::addCacheableShaderFromSourceCode
            (pQVar3,(ShaderType)in_ESI.i,(char *)this_01);
  pQVar4 = QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::
           operator->((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                       *)this_00);
  (**(code **)(*(long *)pQVar4 + 0x60))();
  QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
            ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *)
             this_00);
  bVar1 = QOpenGLShaderProgram::isLinked
                    ((QOpenGLShaderProgram *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (bVar1) {
    pQVar3 = QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::
             operator->((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>
                         *)this_00);
    QOpenGLShaderProgram::bind(pQVar3,iVar2,__addr,__len);
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::attributeLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)&(this_00->context).file = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::uniformLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)((long)&(this_00->context).file + 4) = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::attributeLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)&(this_00->context).function = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::uniformLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)((long)&(this_00->context).function + 4) = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::uniformLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)&(this_00->context).category = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    iVar2 = QOpenGLShaderProgram::uniformLocation
                      ((QOpenGLShaderProgram *)this_01,(char *)in_stack_ffffffffffffff58);
    *(int *)((long)&(this_00->context).category + 4) = iVar2;
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    QOpenGLShaderProgram::setUniformValue
              ((QOpenGLShaderProgram *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
               ,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    QOpenGLShaderProgram::release
              ((QOpenGLShaderProgram *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
              );
  }
  else {
    QMessageLogger::QMessageLogger
              (this_01,(char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QMessageLogger::warning();
    t = (QString *)
        QDebug::operator<<((QDebug *)pQVar3,(char *)CONCAT44(in_ESI.i,in_stack_ffffffffffffff98));
    QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_>::operator->
              ((QScopedPointer<QOpenGLShaderProgram,_QScopedPointerDeleter<QOpenGLShaderProgram>_> *
               )this_00);
    QOpenGLShaderProgram::log(local_50,__x);
    QDebug::operator<<((QDebug *)this_01,t);
    QString::~QString((QString *)0x19d2fb);
    QDebug::~QDebug(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::buildProgram(ProgramIndex idx, const char *vs, const char *fs)
{
    Program *p = &programs[idx];

    p->glProgram.reset(new QOpenGLShaderProgram);

    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Vertex, vs);
    p->glProgram->addCacheableShaderFromSourceCode(QOpenGLShader::Fragment, fs);
    p->glProgram->link();
    if (!p->glProgram->isLinked()) {
        qWarning() << "Could not link shader program:\n" << p->glProgram->log();
        return false;
    }

    p->glProgram->bind();

    p->vertexCoordAttribPos = p->glProgram->attributeLocation("vertexCoord");
    p->vertexTransformUniformPos = p->glProgram->uniformLocation("vertexTransform");
    p->textureCoordAttribPos = p->glProgram->attributeLocation("textureCoord");
    p->textureTransformUniformPos = p->glProgram->uniformLocation("textureTransform");
    p->swizzleUniformPos = p->glProgram->uniformLocation("swizzle");
    p->opacityUniformPos = p->glProgram->uniformLocation("opacity");

    p->glProgram->setUniformValue(p->swizzleUniformPos, false);

    // minmize state left set after a create()
    p->glProgram->release();

    return true;
}